

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void DumpString(TString *s,DumpState *D)

{
  size_t size_00;
  size_t size;
  
  if (s != (TString *)0x0) {
    if (s->tt == '\x04') {
      size_00 = (size_t)s->shrlen;
    }
    else {
      size_00 = (s->u).lnglen;
    }
    size = size_00 + 1;
    if (size < 0xff) {
      DumpByte((int)size,D);
    }
    else {
      DumpByte(0xff,D);
      DumpBlock(&size,8,D);
      size_00 = size - 1;
    }
    DumpBlock(s + 1,size_00,D);
    return;
  }
  DumpByte(0,D);
  return;
}

Assistant:

static void DumpString(const TString *s, DumpState *D) {
    if (s == NULL)
        DumpByte(0, D);
    else {
        size_t size = tsslen(s) + 1;  /* include trailing '\0' */
        const char *str = getstr(s);
        if (size < 0xFF)
            DumpByte(cast_int(size), D);
        else {
            DumpByte(0xFF, D);
            DumpVar(size, D);
        }
        DumpVector(str, size - 1, D);  /* no need to save '\0' */
    }
}